

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

StringBuilder * __thiscall Potassco::StringBuilder::resize(StringBuilder *this,size_t n,char c)

{
  string *psVar1;
  uint8_t uVar2;
  Type TVar3;
  ulong in_RSI;
  StringBuilder *in_RDI;
  undefined7 unaff_retaddr;
  char unaff_retaddr_00;
  Buffer b;
  ulong local_28;
  ulong local_20;
  
  buffer((StringBuilder *)CONCAT17(unaff_retaddr_00,unaff_retaddr));
  if (local_28 < in_RSI) {
    if ((local_20 < in_RSI) && (uVar2 = tag(in_RDI), uVar2 == 0x80)) {
      fail(-2,"StringBuilder &Potassco::StringBuilder::resize(std::size_t, char)",0x150,
           "n <= b.size || tag() != Buf","StringBuilder: buffer too small",0);
    }
    append((StringBuilder *)b.used,(size_t)b.head,unaff_retaddr_00);
  }
  else if (in_RSI < local_28) {
    TVar3 = type((StringBuilder *)0x13fbda);
    if (TVar3 == Str) {
      std::__cxx11::string::resize((ulong)(in_RDI->field_0).str_);
    }
    else {
      TVar3 = type((StringBuilder *)0x13fbfb);
      if (TVar3 == Buf) {
        psVar1 = (in_RDI->field_0).str_;
        (in_RDI->field_0).buf_.used = in_RSI;
        (&psVar1->_M_dataplus)[in_RSI] = (_Alloc_hider)0x0;
      }
      else {
        (in_RDI->field_0).sbo_[in_RSI] = '\0';
        setTag(in_RDI,'?' - (char)in_RSI);
      }
    }
  }
  return in_RDI;
}

Assistant:

StringBuilder& StringBuilder::resize(std::size_t n, char c) {
	Buffer b = buffer();
	if (n > b.used) {
		POTASSCO_REQUIRE(n <= b.size || tag() != Buf, "StringBuilder: buffer too small");
		append(n - b.used, c);
	}
	else if (n < b.used) {
		if      (type() == Str) { str_->resize(n); }
		else if (type() == Buf) { buf_.head[buf_.used = n] = 0; }
		else                    { sbo_[n] = 0; setTag(static_cast<uint8_t>(SboCap - n)); }
	}
	return *this;
}